

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForField
          (Generator *this,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Descriptor *pDVar2;
  int iVar3;
  string field_name;
  string field_options;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  MessageLite::SerializeAsString_abi_cxx11_(&local_a8,*(MessageLite **)(field + 0x38));
  OptionsValue(&local_48,this,&local_a8);
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar3 == 0) goto LAB_0028c80d;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  if (((byte)field[1] & 8) == 0) {
    pDVar2 = *(Descriptor **)(field + 0x20);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"fields_by_name","");
    FieldReferencingExpression(&local_68,this,pDVar2,field,&local_88);
LAB_0028c79a:
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  else {
    pDVar2 = *(Descriptor **)(field + 0x28);
    if (pDVar2 != (Descriptor *)0x0) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"extensions_by_name","");
      FieldReferencingExpression(&local_68,this,pDVar2,field,&local_88);
      goto LAB_0028c79a;
    }
    std::__cxx11::string::_M_assign((string *)&local_a8);
  }
  io::Printer::Print<char[11],std::__cxx11::string,char[17],std::__cxx11::string>
            (this->printer_,
             "$descriptor$._options = None\n$descriptor$._serialized_options = $serialized_value$\n"
             ,(char (*) [11])0x43d321,&local_a8,(char (*) [17])"serialized_value",&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
LAB_0028c80d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::FixOptionsForField(const FieldDescriptor& field) const {
  std::string field_options = OptionsValue(field.options().SerializeAsString());
  if (field_options != "None") {
    std::string field_name;
    if (field.is_extension()) {
      if (field.extension_scope() == nullptr) {
        // Top level extensions.
        field_name = field.name();
      } else {
        field_name = FieldReferencingExpression(field.extension_scope(), field,
                                                "extensions_by_name");
      }
    } else {
      field_name = FieldReferencingExpression(field.containing_type(), field,
                                              "fields_by_name");
    }
    PrintDescriptorOptionsFixingCode(field_name, field_options, printer_);
  }
}